

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O3

void __thiscall
MeshDenoisingViaL0Minimization::solveVertices
          (MeshDenoisingViaL0Minimization *this,TriMesh *mesh,MatrixXd *initial_vertices_matrix,
          vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
          *edge_vertex_handle,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coef,vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *delta,double alpha,double beta)

{
  size_t *this_00;
  size_t *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int **pp_Var5;
  double *pdVar6;
  int *piVar7;
  long lVar8;
  ArrayKernel *pAVar9;
  VertexHandle _idx;
  value_handle vVar10;
  mesh_ptr pPVar11;
  undefined8 uVar12;
  bool bVar13;
  Index rows;
  Index cols;
  value_type _fh;
  int iVar14;
  value_type vVar15;
  undefined8 *puVar16;
  mapped_type *pmVar17;
  Face *pFVar18;
  long lVar19;
  _Base_ptr p_Var20;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_02;
  reference pvVar21;
  _Self __tmp;
  PolyConnectivity *this_03;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  VertexIter VVar27;
  undefined1 auStack_3b8 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  SparseMatrix<double,_0,_int> coef_matrix;
  map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
  vertex_coef;
  set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
  edge_handle;
  BaseHandle local_118;
  VertexHandle v3;
  undefined1 auStack_114 [12];
  void *local_100;
  MatrixXd right_term;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triple;
  undefined1 local_b8 [8];
  VertexIter v_it;
  undefined1 auStack_98 [8];
  MatrixXd vertices_term;
  double local_70;
  double local_68;
  double local_60;
  key_type local_4c;
  _func_int **pp_Stack_48;
  VertexHandle v4;
  
  pdVar6 = (double *)
           (initial_vertices_matrix->
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar19 = (initial_vertices_matrix->
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  uVar22 = lVar19 * (long)pdVar6;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)delta;
  v_it._8_8_ = mesh;
  pp_Stack_48 = (_func_int **)alpha;
  if (uVar22 == 0) {
    local_100 = (void *)0x0;
  }
  else if ((uVar22 >> 0x3d != 0) || (local_100 = malloc(uVar22 * 8), local_100 == (void *)0x0)) {
    puVar16 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar16 = std::streambuf::xsgetn;
    __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       pdVar6;
  right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       lVar19;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_100,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)initial_vertices_matrix);
  uVar12 = v_it._8_8_;
  rows = (**(code **)(*(long *)v_it._8_8_ + 0x10))(v_it._8_8_);
  cols = (**(code **)(*(long *)uVar12 + 0x10))(uVar12);
  solver.m_detPermR._0_1_ = 0;
  stack0xfffffffffffffe2c = 0;
  coef_matrix.m_innerSize = 0;
  coef_matrix._12_4_ = 0;
  coef_matrix.m_outerIndex = (Index *)0x0;
  coef_matrix.m_innerNonZeros = (Index *)0x0;
  coef_matrix.m_data.m_values = (Scalar_conflict *)0x0;
  coef_matrix.m_data.m_indices = (Index *)0x0;
  coef_matrix.m_data.m_size = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize
            ((SparseMatrix<double,_0,_int> *)&solver.m_detPermR,rows,cols);
  this_03 = (PolyConnectivity *)v_it._8_8_;
  right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  triple.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vertex_coef;
  vertex_coef._M_t._M_impl._0_4_ = 0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&edge_handle;
  edge_handle._M_t._M_impl._0_4_ = 0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  _local_b8 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)v_it._8_8_);
  this_00 = &vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this_01 = &coef_matrix.m_data.m_allocatedSize;
  while( true ) {
    VVar27 = OpenMesh::PolyConnectivity::vertices_end(this_03);
    if ((local_b8 == (undefined1  [8])VVar27.mesh_) &&
       (v_it.mesh_._0_4_ == (BaseHandle)VVar27.hnd_.super_BaseHandle.idx_)) break;
    std::
    _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
    ::clear((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
             *)this_00);
    std::
    _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
    ::clear((_Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
             *)this_01);
    pmVar17 = std::
              map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
              ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                            *)this_01,(key_type *)&v_it);
    *pmVar17 = 1.0;
    OpenMesh::Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::GenericCirculatorT
              ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                *)auStack_3b8,this_03,(VertexHandle)v_it.mesh_._0_4_,false);
    while ((solver._4_4_ != -1 &&
           ((solver.m_info != solver._4_4_ || ((int)solver.m_lastError._M_dataplus._M_p == 0))))) {
      _fh = OpenMesh::Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                         *)auStack_3b8);
      pFVar18 = OpenMesh::ArrayKernel::face
                          (&this_03->super_ArrayKernel,(FaceHandle)_fh.super_BaseHandle.idx_);
      iVar14 = (pFVar18->halfedge_handle_).super_BaseHandle.idx_;
      vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)CONCAT44(iVar14,iVar14);
      vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = -0x100000000;
      auStack_98 = (undefined1  [8])this_03;
      while ((iVar14 != -1 &&
             (((int)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data != iVar14 ||
              ((int)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows == 0))))) {
        vVar15 = OpenMesh::Iterators::
                 GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                 ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                              *)auStack_98);
        local_118 = vVar15.super_BaseHandle.idx_;
        std::
        _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
        ::_M_insert_unique<OpenMesh::EdgeHandle>
                  ((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                    *)this_00,(EdgeHandle *)&stack0xfffffffffffffee8);
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
        ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                      *)&stack0xfffffffffffffee8,
                     (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                      *)auStack_98,0);
        iVar14 = vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data._4_4_;
      }
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)auStack_98,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)auStack_3b8,0);
    }
    if (edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)&edge_handle) {
      local_68 = 0.0;
      local_70 = 0.0;
      local_60 = 0.0;
    }
    else {
      local_60 = 0.0;
      local_70 = 0.0;
      local_68 = 0.0;
      p_Var20 = edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        bVar13 = OpenMesh::PolyConnectivity::is_boundary
                           ((PolyConnectivity *)v_it._8_8_,(EdgeHandle)p_Var20[1]._M_color);
        if (!bVar13) {
          lVar19 = (long)(int)p_Var20[1]._M_color;
          lVar8 = lVar19 * 0x18;
          piVar7 = *(int **)&(edge_vertex_handle->
                             super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar19].
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data;
          auStack_3b8._0_4_ = *piVar7;
          auStack_98._0_4_ = piVar7[1];
          local_118.idx_ = piVar7[2];
          local_4c.super_BaseHandle.idx_ = (BaseHandle)piVar7[3];
          pdVar6 = (coef->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar19].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar25 = *pdVar6;
          dVar24 = pdVar6[1];
          vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = (DenseIndex)pdVar6[2];
          dVar1 = pdVar6[3];
          lVar19 = *(long *)edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count;
          dVar26 = *(double *)(lVar19 + lVar8);
          dVar2 = *(double *)(lVar19 + 8 + lVar8);
          dVar3 = *(double *)(lVar19 + 0x10 + lVar8);
          if ((BaseHandle)*piVar7 == v_it.mesh_._0_4_) {
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_3b8);
            dVar4 = *pmVar17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_3b8);
            dVar23 = dVar25 * beta;
            *pmVar17 = dVar23 * dVar25 + dVar4 + (double)pp_Stack_48;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_98);
            dVar4 = *pmVar17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_98);
            *pmVar17 = dVar24 * dVar23 + (dVar4 - (double)pp_Stack_48);
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&stack0xfffffffffffffee8);
            dVar24 = *pmVar17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&stack0xfffffffffffffee8);
            *pmVar17 = (double)vertices_term.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols * dVar23 + dVar24 + (double)pp_Stack_48;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,&local_4c);
            dVar24 = *pmVar17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,&local_4c);
            *pmVar17 = dVar23 * dVar1 + (dVar24 - (double)pp_Stack_48);
            dVar24 = dVar25;
LAB_00162be1:
            dVar26 = dVar26 * beta * dVar24;
            dVar25 = dVar2 * beta * dVar24;
            dVar24 = dVar3 * beta * dVar24;
          }
          else {
            if ((BaseHandle)piVar7[1] == v_it.mesh_._0_4_) {
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_3b8);
              dVar4 = *pmVar17;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_3b8);
              dVar23 = dVar24 * beta;
              *pmVar17 = dVar25 * dVar23 + (dVar4 - (double)pp_Stack_48);
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_98);
              dVar25 = *pmVar17;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_98);
              *pmVar17 = dVar23 * dVar24 + dVar25 + (double)pp_Stack_48;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)&stack0xfffffffffffffee8);
              dVar25 = *pmVar17;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)&stack0xfffffffffffffee8);
              *pmVar17 = (double)vertices_term.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_cols * dVar23 + (dVar25 - (double)pp_Stack_48);
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,&local_4c);
              dVar25 = *pmVar17;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,&local_4c);
              *pmVar17 = dVar23 * dVar1 + dVar25 + (double)pp_Stack_48;
              goto LAB_00162be1;
            }
            if ((BaseHandle)piVar7[2] == v_it.mesh_._0_4_) {
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_3b8);
              dVar4 = *pmVar17;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_3b8);
              dVar23 = (double)vertices_term.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols * beta;
              *pmVar17 = dVar25 * dVar23 + dVar4 + (double)pp_Stack_48;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_98);
              dVar25 = *pmVar17;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_98);
              *pmVar17 = dVar24 * dVar23 + (dVar25 - (double)pp_Stack_48);
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)&stack0xfffffffffffffee8);
              dVar25 = *pmVar17;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)&stack0xfffffffffffffee8);
              *pmVar17 = dVar23 * (double)vertices_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_cols + dVar25 + (double)pp_Stack_48;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,&local_4c);
              dVar25 = *pmVar17;
              pmVar17 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,&local_4c);
              *pmVar17 = dVar23 * dVar1 + (dVar25 - (double)pp_Stack_48);
              dVar24 = (double)vertices_term.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols;
              goto LAB_00162be1;
            }
            if (local_4c.super_BaseHandle.idx_ != v_it.mesh_._0_4_) goto LAB_00162c17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_3b8);
            dVar4 = *pmVar17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_3b8);
            dVar23 = dVar1 * beta;
            *pmVar17 = dVar25 * dVar23 + (dVar4 - (double)pp_Stack_48);
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_98);
            dVar25 = *pmVar17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_98);
            *pmVar17 = dVar24 * dVar23 + dVar25 + (double)pp_Stack_48;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&stack0xfffffffffffffee8);
            dVar25 = *pmVar17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&stack0xfffffffffffffee8);
            *pmVar17 = (double)vertices_term.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols * dVar23 + (dVar25 - (double)pp_Stack_48);
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,&local_4c);
            dVar25 = *pmVar17;
            pmVar17 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,&local_4c);
            *pmVar17 = dVar23 * dVar1 + dVar25 + (double)pp_Stack_48;
            dVar26 = dVar26 * beta * dVar1;
            dVar25 = dVar2 * beta * dVar1;
            dVar24 = dVar3 * beta * dVar1;
          }
          local_68 = local_68 + dVar26;
          local_70 = local_70 + dVar25;
          local_60 = local_60 + dVar24;
        }
LAB_00162c17:
        p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
      } while (p_Var20 != (_Rb_tree_node_base *)&edge_handle);
    }
    lVar19 = (long)(int)v_it.mesh_._0_4_;
    if ((((lVar19 < 0) ||
         ((long)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data <= lVar19)) ||
        (right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows < 1)) ||
       ((*(double *)((long)local_100 + lVar19 * 8) =
              local_68 + *(double *)((long)local_100 + lVar19 * 8),
        right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        == 1 || (*(double *)
                  ((long)local_100 +
                  lVar19 * 8 +
                  (long)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data * 8) =
                      local_70 +
                      *(double *)
                       ((long)local_100 +
                       lVar19 * 8 +
                       (long)right_term.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data * 8),
                (ulong)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows < 3)))) goto LAB_00163163;
    *(double *)
     ((long)local_100 +
     lVar19 * 8 +
     (long)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data * 0x10) =
         local_60 +
         *(double *)
          ((long)local_100 +
          lVar19 * 8 +
          (long)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data * 0x10);
    for (p_Var20 = vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        this_03 = (PolyConnectivity *)v_it._8_8_, vVar10.super_BaseHandle.idx_ = v_it.mesh_._0_4_,
        p_Var20 != (_Rb_tree_node_base *)&vertex_coef;
        p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
      auStack_3b8._4_4_ = p_Var20[1]._M_color;
      auStack_3b8._0_4_ = v_it.mesh_._0_4_;
      solver._0_8_ = p_Var20[1]._M_parent;
      if (triple.
          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
        _M_realloc_insert<Eigen::Triplet<double,int>>
                  ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                   &right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols,(iterator)0x0,(Triplet<double,_int> *)auStack_3b8);
      }
      else {
        (triple.
         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->m_row = (int)v_it.mesh_._0_4_;
        (triple.
         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->m_col = auStack_3b8._4_4_;
        (triple.
         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->m_value = (double)solver._0_8_;
        triple.
        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             triple.
             super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    pPVar11 = v_it.mesh_;
    v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)vVar10.super_BaseHandle.idx_ + 1);
    if ((ulong)pPVar11 >> 0x20 != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_b8);
    }
  }
  auStack_3b8 = (undefined1  [8])
                right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols;
  auStack_98 = (undefined1  [8])
               triple.
               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  Eigen::internal::
  set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
            ((__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)auStack_3b8,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)auStack_98,(SparseMatrix<double,_0,_int> *)&solver.m_detPermR,0);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             auStack_3b8);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             auStack_3b8,(MatrixType *)&solver.m_detPermR);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             auStack_3b8,(MatrixType *)&solver.m_detPermR);
  if (auStack_3b8[5] == false) {
    __assert_fail("m_factorizationIsOk && \"SparseLU is not initialized.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0xb4,
                  "const internal::solve_retval<SparseLU<_MatrixType, _OrderingType>, Rhs> Eigen::SparseLU<Eigen::SparseMatrix<double>>::solve(const MatrixBase<Rhs> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      != (double *)(long)(int)solver.m_mat._0_4_) {
    __assert_fail("rows()==B.rows() && \"SparseLU::solve(): invalid number of rows of the right hand side matrix B\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0xb6,
                  "const internal::solve_retval<SparseLU<_MatrixType, _OrderingType>, Rhs> Eigen::SparseLU<Eigen::SparseMatrix<double>>::solve(const MatrixBase<Rhs> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  auStack_98 = (undefined1  [8])0x0;
  vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  uVar22 = (ulong)(int)solver.m_lastError.field_2._12_4_;
  if ((long)(right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows | uVar22) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       != 0 && solver.m_lastError.field_2._12_4_ != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
             SEXT816(right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows),0) < (long)uVar22)) {
    puVar16 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar16 = std::streambuf::xsgetn;
    __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)auStack_98,
             right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows * uVar22,uVar22,
             right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows);
  Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>::
  _solve<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *)auStack_3b8,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_100,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)auStack_98);
  _local_118 = OpenMesh::PolyConnectivity::vertices_begin(this_03);
  pAVar9 = &this_03->super_ArrayKernel;
  while( true ) {
    VVar27 = OpenMesh::PolyConnectivity::vertices_end(this_03);
    this_03 = (PolyConnectivity *)v_it._8_8_;
    _idx.super_BaseHandle.idx_ = v3.super_BaseHandle.idx_;
    if (v3.super_BaseHandle.idx_ == ((BaseHandle)VVar27.hnd_.super_BaseHandle.idx_).super_BaseHandle
        && _local_118 == VVar27.mesh_) {
      free((void *)auStack_98);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 auStack_3b8);
      std::
      _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
      ::~_Rb_tree((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                   *)&vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
      ::~_Rb_tree((_Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   *)&coef_matrix.m_data.m_allocatedSize);
      if (right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols != 0) {
        operator_delete((void *)right_term.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols);
      }
      free((void *)coef_matrix._8_8_);
      free(coef_matrix.m_outerIndex);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                ((CompressedStorage<double,_int> *)&coef_matrix.m_innerNonZeros);
      free(local_100);
      return;
    }
    if (((((int)v3.super_BaseHandle.idx_ < 0) ||
         (lVar19 = (long)(int)v3.super_BaseHandle.idx_,
         (long)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data <= lVar19)) ||
        (vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows < 1)) ||
       ((vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows == 1 ||
        ((ulong)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows < 3)))) break;
    pp_Stack_48 = (&(((ArrayKernel *)auStack_98)->super_BaseKernel)._vptr_BaseKernel)[lVar19];
    pp_Var5 = (&(((ArrayKernel *)auStack_98)->super_BaseKernel)._vptr_BaseKernel)
              [(long)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data + lVar19];
    dVar25 = *(double *)
              (&((Triplet<double,_int> *)
                ((long)auStack_98 +
                vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data * 0x10))->m_row + lVar19 * 2);
    this_02 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                        (&(pAVar9->super_BaseKernel).vprops_,
                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                         ((BaseHandle *)(v_it._8_8_ + 0x1a4))->idx_);
    pvVar21 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                        (this_02,(int)_idx.super_BaseHandle.idx_);
    (pvVar21->super_VectorDataT<double,_3>).values_[0] = (double)pp_Stack_48;
    (pvVar21->super_VectorDataT<double,_3>).values_[1] = (double)pp_Var5;
    (pvVar21->super_VectorDataT<double,_3>).values_[2] = dVar25;
    uVar22 = _v3;
    v3.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)((int)local_118._8_4_.super_BaseHandle + 1);
    if (uVar22 >> 0x20 != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)&stack0xfffffffffffffee8);
    }
  }
LAB_00163163:
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x151,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
               );
}

Assistant:

void MeshDenoisingViaL0Minimization::solveVertices(TriMesh &mesh, Eigen::MatrixXd &initial_vertices_matrix,
                                                   std::vector< std::vector<TriMesh::VertexHandle> > &edge_vertex_handle,
                                                   std::vector< std::vector<double> > &coef, std::vector<TriMesh::Point> &delta,
                                                   double alpha, double beta)
{
    Eigen::MatrixXd right_term = initial_vertices_matrix;
    Eigen::SparseMatrix<double> coef_matrix((int)mesh.n_vertices(), (int)mesh.n_vertices());

    std::vector< Eigen::Triplet<double> > triple; triple.clear();

    std::map<TriMesh::VertexHandle, double> vertex_coef;
    std::set<TriMesh::EdgeHandle> edge_handle;;
    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        edge_handle.clear();
        vertex_coef.clear();
        vertex_coef[*v_it] = 1.0;
        for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(*v_it); vf_it.is_valid(); vf_it++)
        {
            for(TriMesh::FaceEdgeIter fe_it = mesh.fe_iter(*vf_it); fe_it.is_valid(); fe_it++)
            {
                edge_handle.insert(*fe_it);
            }
        }

        TriMesh::Point right(0.0, 0.0, 0.0);
        for(std::set<TriMesh::EdgeHandle>::iterator s_it = edge_handle.begin(); s_it != edge_handle.end(); s_it++)
        {
            if(!mesh.is_boundary(*s_it))
            {
                int index = (*s_it).idx();
                TriMesh::VertexHandle v1 = edge_vertex_handle[index][0],
                        v2 = edge_vertex_handle[index][1],
                        v3 = edge_vertex_handle[index][2],
                        v4 = edge_vertex_handle[index][3];
                double coe1 = coef[index][0],
                        coe2 = coef[index][1],
                        coe3 = coef[index][2],
                        coe4 = coef[index][3];
                TriMesh::Point temp_delta = delta[index];
                if(v1 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] + alpha + beta * coe1 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] - alpha + beta * coe1 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] + alpha + beta * coe1 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] - alpha + beta * coe1 * coe4;
                    right += temp_delta * beta * coe1;
                }
                else if(v2 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] - alpha + beta * coe2 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] + alpha + beta * coe2 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] - alpha + beta * coe2 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] + alpha + beta * coe2 * coe4;
                    right += temp_delta * beta * coe2;
                }
                else if(v3 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] + alpha + beta * coe3 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] - alpha + beta * coe3 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] + alpha + beta * coe3 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] - alpha + beta * coe3 * coe4;
                    right += temp_delta * beta * coe3;
                }
                else if(v4 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] - alpha + beta * coe4 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] + alpha + beta * coe4 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] - alpha + beta * coe4 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] + alpha + beta * coe4 * coe4;
                    right += temp_delta * beta * coe4;
                }
            }
        }
        right_term(v_it->idx(), 0) += right[0];
        right_term(v_it->idx(), 1) += right[1];
        right_term(v_it->idx(), 2) += right[2];

        for(std::map<TriMesh::VertexHandle, double>::iterator m_it = vertex_coef.begin(); m_it != vertex_coef.end(); m_it++)
        {
            triple.push_back(Eigen::Triplet<double>(v_it->idx(), m_it->first.idx(), m_it->second));
        }
    }
    coef_matrix.setFromTriplets(triple.begin(), triple.end());

    Eigen::SparseLU<Eigen::SparseMatrix<double> > solver;
    solver.analyzePattern(coef_matrix);
    solver.factorize(coef_matrix);
    Eigen::MatrixXd vertices_term = solver.solve(right_term);

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        int index = v_it->idx();
        TriMesh::Point pt = TriMesh::Point(vertices_term(index,0), vertices_term(index,1), vertices_term(index,2));
        mesh.set_point(*v_it, pt);
    }
}